

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugi.cpp
# Opt level: O1

xml_node __thiscall
NULLCPugiXML::xml_node__next_sibling0(NULLCPugiXML *this,NULLCArray name,xml_node *ptr)

{
  undefined4 in_register_00000014;
  xml_node ret;
  xml_node local_20;
  
  if (this == (NULLCPugiXML *)0x0) {
    nullcThrowError("name is empty",name.ptr);
    local_20._root = (xml_node_struct *)0x0;
    pugi::xml_node::xml_node(&local_20);
  }
  else {
    pugi::xml_node::xml_node(&local_20);
    local_20 = pugi::xml_node::next_sibling
                         ((xml_node *)CONCAT44(in_register_00000014,name.len),(char_t *)this);
  }
  return (xml_node)(xml_node)local_20._root;
}

Assistant:

xml_node xml_node__next_sibling0(NULLCArray name, xml_node* ptr)
	{
		if(!name.ptr)
		{
			nullcThrowError("name is empty");
			return xml_node();
		}
		xml_node ret;
		ret.node = ptr->node.next_sibling(name.ptr);
		return ret;
	}